

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::RequiresError::RequiresError(RequiresError *this,string *curname,string *subname)

{
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  RequiresError *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_ffffffffffffffa0;
  _Alloc_hider in_stack_ffffffffffffffa8;
  ExitCodes exit_code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  
  exit_code = (ExitCodes)((ulong)in_RSI >> 0x20);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffa8;
  msg = in_RDI;
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffffa8._M_p,in_stack_ffffffffffffffa0);
  ::std::operator+(__lhs,in_RDI);
  RequiresError(unaff_retaddr,msg,exit_code);
  ::std::__cxx11::string::~string(in_RDI);
  ::std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

RequiresError(std::string curname, std::string subname)
        : RequiresError(curname + " requires " + subname, ExitCodes::RequiresError) {}